

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall google::protobuf::io::ArrayOutputStream::BackUp(ArrayOutputStream *this,int count)

{
  LogMessage *pLVar1;
  LogFinisher local_c9;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if (this->last_returned_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/zero_copy_stream_impl_lite.cc",
               0x7f);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (last_returned_size_) > (0): ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,"BackUp() can only be called after a successful Next().");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar1);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->last_returned_size_ < count) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/zero_copy_stream_impl_lite.cc",
               0x81);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_90,"CHECK failed: (count) <= (last_returned_size_): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/zero_copy_stream_impl_lite.cc",
               0x82);
    pLVar1 = internal::LogMessage::operator<<(&local_c8,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(&local_c9,pLVar1);
    internal::LogMessage::~LogMessage(&local_c8);
  }
  this->position_ = this->position_ - count;
  this->last_returned_size_ = 0;
  return;
}

Assistant:

void ArrayOutputStream::BackUp(int count) {
  GOOGLE_CHECK_GT(last_returned_size_, 0)
      << "BackUp() can only be called after a successful Next().";
  GOOGLE_CHECK_LE(count, last_returned_size_);
  GOOGLE_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ = 0;  // Don't let caller back up further.
}